

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_rc_pick_q_and_bounds
              (AV1_COMP *cpi,int width,int height,int gf_index,int *bottom_index,int *top_index)

{
  AV1_PRIMARY *pAVar1;
  AV1_PRIMARY *pAVar2;
  int iVar3;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  AV1_COMP *in_RDI;
  int *in_R9;
  AV1_COMP *unaff_retaddr;
  GF_GROUP *gf_group;
  int q;
  PRIMARY_RATE_CONTROL *p_rc;
  int in_stack_00000030;
  int *in_stack_00000128;
  int *in_stack_00000130;
  int in_stack_00000138;
  int in_stack_0000013c;
  AV1_COMP *in_stack_00000140;
  AV1_COMP *in_stack_00001040;
  int local_34;
  undefined4 in_stack_ffffffffffffffe8;
  
  pAVar1 = in_RDI->ppi;
  pAVar2 = in_RDI->ppi;
  if ((((in_RDI->oxcf).rc_cfg.mode == AOM_Q) && ((pAVar2->gf_group).update_type[in_ECX] != '\x03'))
     || (iVar3 = has_no_stats_stage(in_RDI), iVar3 == 0)) {
    local_34 = rc_pick_q_and_bounds
                         ((AV1_COMP *)CONCAT44(width,height),gf_index,in_stack_00000030,
                          bottom_index._4_4_,top_index,(int *)p_rc);
  }
  else if ((in_RDI->oxcf).rc_cfg.mode == AOM_CBR) {
    in_RDI->rec_sse = 0xffffffffffffffff;
    if (((in_RDI->sf).hl_sf.accurate_bit_estimate != 0) &&
       ((in_RDI->common).current_frame.frame_type != '\0')) {
      rc_compute_variance_onepass_rt(in_stack_00001040);
    }
    local_34 = rc_pick_q_and_bounds_no_stats_cbr
                         (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                          (int *)CONCAT44(in_ESI,in_EDX),
                          (int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
    (in_RDI->rc).active_worst_quality = *in_R9;
  }
  else {
    local_34 = rc_pick_q_and_bounds_no_stats
                         (in_stack_00000140,in_stack_0000013c,in_stack_00000138,in_stack_00000130,
                          in_stack_00000128);
  }
  if ((pAVar2->gf_group).update_type[in_ECX] == '\x03') {
    (pAVar1->p_rc).arf_q = local_34;
  }
  return local_34;
}

Assistant:

int av1_rc_pick_q_and_bounds(AV1_COMP *cpi, int width, int height, int gf_index,
                             int *bottom_index, int *top_index) {
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int q;
  // TODO(sarahparker) merge no-stats vbr and altref q computation
  // with rc_pick_q_and_bounds().
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if ((cpi->oxcf.rc_cfg.mode != AOM_Q ||
       gf_group->update_type[gf_index] == ARF_UPDATE) &&
      has_no_stats_stage(cpi)) {
    if (cpi->oxcf.rc_cfg.mode == AOM_CBR) {
      // TODO(yunqing): the results could be used for encoder optimization.
      cpi->rec_sse = UINT64_MAX;
      if (cpi->sf.hl_sf.accurate_bit_estimate &&
          cpi->common.current_frame.frame_type != KEY_FRAME)
        rc_compute_variance_onepass_rt(cpi);

      q = rc_pick_q_and_bounds_no_stats_cbr(cpi, width, height, bottom_index,
                                            top_index);
      // preserve copy of active worst quality selected.
      cpi->rc.active_worst_quality = *top_index;

#if USE_UNRESTRICTED_Q_IN_CQ_MODE
    } else if (cpi->oxcf.rc_cfg.mode == AOM_CQ) {
      q = rc_pick_q_and_bounds_no_stats_cq(cpi, width, height, bottom_index,
                                           top_index);
#endif  // USE_UNRESTRICTED_Q_IN_CQ_MODE
    } else {
      q = rc_pick_q_and_bounds_no_stats(cpi, width, height, bottom_index,
                                        top_index);
    }
  } else {
    q = rc_pick_q_and_bounds(cpi, width, height, gf_index, bottom_index,
                             top_index);
  }
  if (gf_group->update_type[gf_index] == ARF_UPDATE) p_rc->arf_q = q;

  return q;
}